

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  ostream *poVar6;
  long lVar7;
  pointer pbVar8;
  bool bVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string varValue;
  string systemName;
  cmList tokens;
  string varName;
  MapSourceFileFlags sourceFileFlags;
  cmGeneratedFileStream fout;
  string local_4e0;
  long *local_4c0;
  long local_4b8;
  long local_4b0 [2];
  cmMakefile *local_4a0;
  string local_498;
  cmList local_478;
  long *local_460 [2];
  long local_450 [2];
  string local_440 [3];
  ios_base local_3d0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_2c8;
  undefined1 local_298 [616];
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,filename,false,None);
  if (((byte)(*(_func_int **)(local_298._0_8_ + -0x18))[(long)(local_298 + 0x20)] & 5) == 0) {
    psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    psVar5 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    cmSystemTools::RelativePath(&local_498,psVar4,psVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"\t\"folders\":\n\t[\n\t",0x10);
    if (local_498._M_string_length == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"\t{\n\t\t\t\"path\": \"./\"",0x12);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"\t{\n\t\t\t\"path\": \"",0xf);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,local_498._M_dataplus._M_p,local_498._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                         (*(lgs->
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           )._M_impl.super__Vector_impl_data._M_start);
      psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         (*(lgs->
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           )._M_impl.super__Vector_impl_data._M_start);
      cmSystemTools::RelativePath(local_440,psVar4,psVar5);
      if (local_440[0]._M_string_length == 0) {
        bVar2 = false;
        bVar9 = false;
      }
      else if (local_440[0]._M_string_length < 3) {
        bVar9 = true;
        bVar2 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_460,(ulong)local_440);
        iVar3 = std::__cxx11::string::compare((char *)local_460);
        bVar9 = iVar3 != 0;
        bVar2 = true;
      }
      if ((bVar2) && (local_460[0] != local_450)) {
        operator_delete(local_460[0],local_450[0] + 1);
      }
      if ((bVar9) && (this->ExcludeBuildFolder == true)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,",\n\t\t\t\"folder_exclude_patterns\": [\"",0x22);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,local_440[0]._M_dataplus._M_p,
                            local_440[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"]",2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440[0]._M_dataplus._M_p != &local_440[0].field_2) {
        operator_delete(local_440[0]._M_dataplus._M_p,local_440[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t}",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t]",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,",\n\t\"build_systems\":\n\t[\n\t",0x18);
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2c8._M_impl.super__Rb_tree_header._M_header;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
    AppendAllTargets(this,lgs,mf,(cmGeneratedFileStream *)local_298,(MapSourceFileFlags *)&local_2c8
                    );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t]",3);
    local_440[0]._M_dataplus._M_p = (pointer)&local_440[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"CMAKE_SYSTEM_NAME","");
    psVar4 = cmMakefile::GetSafeDefinition(mf,local_440);
    local_4c0 = local_4b0;
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c0,pcVar1,pcVar1 + psVar4->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440[0]._M_dataplus._M_p != &local_440[0].field_2) {
      operator_delete(local_440[0]._M_dataplus._M_p,local_440[0].field_2._M_allocated_capacity + 1);
    }
    local_440[0]._M_dataplus._M_p = (pointer)&local_440[0].field_2;
    pcVar1 = (this->EnvSettings)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_440,pcVar1,pcVar1 + (this->EnvSettings)._M_string_length);
    init._M_len = 1;
    init._M_array = local_440;
    cmList::cmList(&local_478,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440[0]._M_dataplus._M_p != &local_440[0].field_2) {
      operator_delete(local_440[0]._M_dataplus._M_p,local_440[0].field_2._M_allocated_capacity + 1);
    }
    if ((this->EnvSettings)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,",",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\"env\":",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t{",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(char *)local_4c0,local_4b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t{",4);
      local_4a0 = mf;
      if (local_478.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_478.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar8 = local_478.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          lVar7 = std::__cxx11::string::find((char)pbVar8,0x3d);
          if (lVar7 == -1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_440,
                       "Could not parse Env Vars specified in \"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
                       ,0x49);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_440,", corrupted string ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_440,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(local_4a0,FATAL_ERROR,&local_4e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
              operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
            std::ios_base::~ios_base(local_3d0);
          }
          else {
            std::__cxx11::string::substr((ulong)local_440,(ulong)pbVar8);
            std::__cxx11::string::substr((ulong)&local_4e0,(ulong)pbVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t\t\"",5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_298,local_440[0]._M_dataplus._M_p,
                                local_440[0]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":\"",3);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_4e0._M_dataplus._M_p,local_4e0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
              operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440[0]._M_dataplus._M_p != &local_440[0].field_2) {
              operator_delete(local_440[0]._M_dataplus._M_p,
                              local_440[0].field_2._M_allocated_capacity + 1);
            }
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != local_478.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t\t}",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n\t}",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n}",2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_478.Values);
    if (local_4c0 != local_4b0) {
      operator_delete(local_4c0,local_4b0[0] + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  const std::string& sourceRootRelativeToOutput = cmSystemTools::RelativePath(
    lgs[0]->GetBinaryDirectory(), lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty()) {
    fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
    const std::string& outputRelativeToSourceRoot =
      cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                  lgs[0]->GetBinaryDirectory());
    if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
         (outputRelativeToSourceRoot.substr(0, 3) != "../"))) {
      if (this->ExcludeBuildFolder) {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\""
             << outputRelativeToSourceRoot << "\"]";
      }
    }
  } else {
    fout << "\t{\n\t\t\t\"path\": \"./\"";
  }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  this->AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  cmList tokens{ this->EnvSettings };

  if (!this->EnvSettings.empty()) {
    fout << ",";
    fout << "\n\t\"env\":";
    fout << "\n\t{";
    fout << "\n\t\t" << systemName << ":";
    fout << "\n\t\t{";
    for (std::string const& t : tokens) {
      size_t const pos = t.find_first_of('=');

      if (pos != std::string::npos) {
        std::string varName = t.substr(0, pos);
        std::string varValue = t.substr(pos + 1);

        fout << "\n\t\t\t\"" << varName << "\":\"" << varValue << "\"";
      } else {
        std::ostringstream e;
        e << "Could not parse Env Vars specified in "
             "\"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
          << ", corrupted string " << t;
        mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
    }
    fout << "\n\t\t}";
    fout << "\n\t}";
  }
  fout << "\n}";
}